

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O1

vrna_param_t * get_scaled_params(vrna_md_t *md)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  vrna_param_t *pvVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  int (*paiVar9) [8];
  int (*paaiVar10) [5] [5];
  long lVar11;
  int (*paiVar12) [5];
  int (*paaaiVar13) [8] [5] [5];
  int (*paaaaaiVar14) [8] [5] [5] [5] [5];
  int (*paaaaaiVar15) [8] [5] [5] [5] [5];
  int (*paaaaaiVar16) [8] [5] [5] [5] [5];
  int (*paiVar17) [8];
  int (*paaiVar18) [5] [5];
  int (*paiVar19) [5];
  int (*paaaiVar20) [8] [5] [5];
  int (*paaaaiVar21) [8] [5] [5] [5];
  int (*paaaaaiVar22) [8] [5] [5] [5] [5];
  int (*paiVar23) [8];
  int (*paaiVar24) [5] [5];
  int (*paiVar25) [5];
  int (*paaaiVar26) [8] [5] [5];
  int (*paaaaiVar27) [8] [5] [5] [5];
  int (*paaaaaiVar28) [8] [5] [5] [5] [5];
  ulong uVar29;
  int (*paaiVar30) [5] [5];
  vrna_param_t *pvVar31;
  int (*paaaiVar32) [8] [5] [5];
  uint uVar33;
  int (*paaiVar34) [5] [5];
  int (*paaaaiVar35) [8] [5] [5] [5];
  int m;
  int (*paaiVar36) [5] [5];
  int (*paiVar37) [5];
  long lVar38;
  long lVar39;
  int (*paaiVar40) [5] [5];
  int (*paiVar41) [5];
  int m_1;
  int (*paaiVar42) [5] [5];
  int (*paiVar43) [5];
  int (*paaaiVar44) [8] [5] [5];
  int (*paiVar45) [5];
  int (*paaaaiVar46) [8] [5] [5] [5];
  int (*paaaaiVar47) [8] [5] [5] [5];
  int (*paaiVar48) [5] [5];
  int (*paiVar49) [5];
  int (*paaaaaiVar50) [8] [5] [5] [5] [5];
  int (*paaiVar51) [5] [5];
  int (*paiVar52) [5];
  int *piVar53;
  int (*paaiVar54) [5] [5];
  int (*paiVar55) [5];
  int (*paaaaiVar56) [5] [5] [5] [5];
  vrna_param_t *pvVar57;
  long lVar58;
  int (*paaaaiVar59) [5] [5] [5] [5];
  int n;
  ulong uVar60;
  int (*paaaaiVar61) [8] [5] [5] [5];
  long lVar62;
  int (*paaiVar63) [5] [5];
  int (*paiVar64) [5];
  int (*paaaaaiVar65) [8] [5] [5] [5] [5];
  double dVar66;
  double dVar67;
  int (*local_c0) [5];
  
  pvVar5 = (vrna_param_t *)vrna_alloc(0x33ea8);
  memset(pvVar5->param_file,0,0x100);
  pcVar6 = last_parameter_file();
  if (pcVar6 != (char *)0x0) {
    pcVar6 = last_parameter_file();
    strncpy(pvVar5->param_file,pcVar6,0xff);
  }
  memcpy(&pvVar5->model_details,md,0x7e8);
  dVar66 = md->temperature;
  pvVar5->temperature = dVar66;
  dVar66 = (dVar66 + 273.15) / Tmeasure;
  pvVar5->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dVar66);
  pvVar5->lxc = lxc37 * dVar66;
  pvVar5->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dVar66);
  pvVar5->MultipleCA = (int)((double)MultipleCAdH - (double)(MultipleCAdH - MultipleCA37) * dVar66);
  pvVar5->MultipleCB = (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dVar66);
  pvVar5->TerminalAU = (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar66);
  pvVar5->DuplexInit = (int)((double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar66);
  pvVar5->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar66);
  pvVar5->PS_penalty = -0x8a;
  pvVar5->PSM_penalty = 0x3ef;
  pvVar5->PSP_penalty = 0x5dc;
  pvVar5->PB_penalty = 0xf6;
  pvVar5->PUP_penalty = 6;
  pvVar5->PPS_penalty = 0x60;
  pvVar5->e_stP_penalty = 0.89;
  pvVar5->e_intP_penalty = 0.74;
  pvVar5->ap_penalty = 0x155;
  pvVar5->bp_penalty = 0x38;
  pvVar5->cp_penalty = 0xc;
  pvVar5->a_penalty = 0x153;
  pvVar5->b_penalty = 3;
  pvVar5->c_penalty = 2;
  pvVar5->MLclosing = (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar66);
  pvVar5->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar66);
  pvVar5->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar53 = pvVar5->gquad[2] + 3;
  lVar7 = 2;
  do {
    uVar29 = 0;
    do {
      dVar1 = (double)GQuadAlphadH;
      iVar3 = GQuadAlphadH - GQuadAlpha37;
      dVar67 = (double)GQuadBetadH;
      iVar4 = GQuadBetadH - GQuadBeta37;
      uVar60 = uVar29 + 1;
      dVar2 = log((double)(uVar60 & 0xffffffff));
      piVar53[uVar29] =
           (int)(dVar2 * (dVar67 - (double)iVar4 * dVar66)) +
           (int)(dVar1 - (double)iVar3 * dVar66) * ((int)lVar7 + -1);
      uVar29 = uVar60;
    } while (uVar60 != 0x2b);
    lVar7 = lVar7 + 1;
    piVar53 = piVar53 + 0x2e;
  } while (lVar7 != 8);
  lVar7 = 0;
  do {
    pvVar5->hairpin[lVar7] =
         (int)((double)hairpindH[lVar7] - (double)(hairpindH[lVar7] - hairpin37[lVar7]) * dVar66);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1f);
  lVar7 = 0;
  do {
    *(int *)((long)pvVar5->bulge + lVar7) =
         (int)((double)*(int *)((long)bulgedH + lVar7) -
              (double)(*(int *)((long)bulgedH + lVar7) - *(int *)((long)bulge37 + lVar7)) * dVar66);
    *(int *)((long)pvVar5->internal_loop + lVar7) =
         (int)((double)*(int *)((long)internal_loopdH + lVar7) -
              (double)(*(int *)((long)internal_loopdH + lVar7) -
                      *(int *)((long)internal_loop37 + lVar7)) * dVar66);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x7c);
  if (Tetraloops[0] != '\0') {
    uVar29 = 0;
    uVar33 = 7;
    do {
      pvVar5->Tetraloop_E[uVar29] =
           (int)((double)TetraloopdH[uVar29] -
                (double)(TetraloopdH[uVar29] - Tetraloop37[uVar29]) * dVar66);
      uVar29 = (ulong)((int)uVar29 + 1);
      uVar60 = (ulong)uVar33;
      sVar8 = strlen(Tetraloops);
      uVar33 = uVar33 + 7;
    } while (uVar60 < sVar8);
  }
  if (Triloops[0] != '\0') {
    uVar29 = 0;
    uVar33 = 5;
    do {
      pvVar5->Triloop_E[uVar29] =
           (int)((double)TriloopdH[uVar29] -
                (double)(TriloopdH[uVar29] - Triloop37[uVar29]) * dVar66);
      uVar29 = (ulong)((int)uVar29 + 1);
      uVar60 = (ulong)uVar33;
      sVar8 = strlen(Triloops);
      uVar33 = uVar33 + 5;
    } while (uVar60 < sVar8);
  }
  if (Hexaloops[0] != '\0') {
    uVar29 = 0;
    uVar33 = 9;
    do {
      pvVar5->Hexaloop_E[uVar29] =
           (int)((double)HexaloopdH[uVar29] -
                (double)(HexaloopdH[uVar29] - Hexaloop37[uVar29]) * dVar66);
      uVar29 = (ulong)((int)uVar29 + 1);
      uVar60 = (ulong)uVar33;
      sVar8 = strlen(Hexaloops);
      uVar33 = uVar33 + 9;
    } while (uVar60 < sVar8);
  }
  lVar7 = 0xc767;
  do {
    *(int *)((long)(pvVar5->stack + -1) + 0x1c + lVar7 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar66);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xc76f);
  paiVar9 = pvVar5->stack;
  paiVar17 = stackdH;
  paiVar23 = stack37;
  lVar7 = 0;
  do {
    lVar39 = 0;
    do {
      (*paiVar9)[lVar39] =
           (int)((double)(*paiVar17)[lVar39] -
                (double)((*paiVar17)[lVar39] - (*paiVar23)[lVar39]) * dVar66);
      lVar39 = lVar39 + 1;
    } while (lVar39 != 8);
    lVar7 = lVar7 + 1;
    paiVar17 = paiVar17 + 1;
    paiVar23 = paiVar23 + 1;
    paiVar9 = paiVar9 + 1;
  } while (lVar7 != 8);
  paaiVar18 = mismatchIdH;
  paaiVar34 = mismatchI37;
  paaiVar24 = mismatchHdH;
  paaiVar36 = mismatchH37;
  paaiVar40 = mismatch1nIdH;
  paaiVar42 = mismatch1nI37;
  paaiVar10 = mismatch23IdH;
  paaiVar48 = mismatch23I37;
  paaiVar51 = mismatchMdH;
  paaiVar63 = mismatchM37;
  paaiVar54 = mismatchExtdH;
  paaiVar30 = mismatchExt37;
  lVar7 = 0;
  pvVar57 = pvVar5;
  do {
    lVar39 = 0;
    paiVar12 = *paaiVar18;
    paiVar19 = *paaiVar24;
    pvVar31 = pvVar57;
    paiVar25 = *paaiVar34;
    paiVar37 = *paaiVar36;
    paiVar41 = *paaiVar40;
    paiVar43 = *paaiVar42;
    paiVar45 = *paaiVar10;
    paiVar49 = *paaiVar48;
    paiVar52 = *paaiVar51;
    paiVar55 = *paaiVar54;
    paiVar64 = *paaiVar63;
    local_c0 = *paaiVar30;
    do {
      lVar11 = 0;
      do {
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar12 + lVar11);
        *(int *)((long)pvVar31->mismatchI[0][0] + lVar11) =
             (int)((double)iVar3 -
                  (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar25 + lVar11)) * dVar66);
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar19 + lVar11);
        *(int *)((long)pvVar31->mismatchH[0][0] + lVar11) =
             (int)((double)iVar3 -
                  (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar37 + lVar11)) * dVar66);
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar41 + lVar11);
        *(int *)((long)pvVar31->mismatch1nI[0][0] + lVar11) =
             (int)((double)iVar3 -
                  (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar43 + lVar11)) * dVar66);
        iVar3 = *(int *)((long)*(int (*) [5])*paiVar45 + lVar11);
        *(int *)((long)pvVar31->mismatch23I[0][0] + lVar11) =
             (int)((double)iVar3 -
                  (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar49 + lVar11)) * dVar66);
        if (md->dangles == 0) {
          *(undefined4 *)((long)pvVar31->mismatchExt[0][0] + lVar11) = 0;
          uVar33 = 0;
          lVar58 = 0x1218;
        }
        else {
          iVar3 = *(int *)((long)*(int (*) [5])*paiVar52 + lVar11);
          uVar33 = (uint)((double)iVar3 -
                         (double)(iVar3 - *(int *)((long)*(int (*) [5])*paiVar64 + lVar11)) * dVar66
                         );
          *(uint *)((long)pvVar31->mismatchM[0][0] + lVar11) = (int)uVar33 >> 0x1f & uVar33;
          iVar3 = *(int *)((long)*(int (*) [5])*paiVar55 + lVar11);
          uVar33 = (uint)((double)iVar3 -
                         (double)(iVar3 - *(int *)((long)*(int (*) [5])*local_c0 + lVar11)) * dVar66
                         );
          uVar33 = (int)uVar33 >> 0x1f & uVar33;
          lVar58 = 0x278;
        }
        *(uint *)((long)(pvVar31->stack + -1) + 0x1c + lVar11 + lVar58) = uVar33;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x14);
      lVar39 = lVar39 + 1;
      pvVar31 = (vrna_param_t *)(pvVar31->stack[0] + 4);
      paiVar12 = paiVar12 + 1;
      paiVar25 = paiVar25 + 1;
      paiVar19 = paiVar19 + 1;
      paiVar37 = paiVar37 + 1;
      paiVar41 = paiVar41 + 1;
      paiVar43 = paiVar43 + 1;
      paiVar45 = paiVar45 + 1;
      paiVar49 = paiVar49 + 1;
      paiVar52 = paiVar52 + 1;
      paiVar64 = paiVar64 + 1;
      paiVar55 = paiVar55 + 1;
      local_c0 = local_c0 + 1;
    } while (lVar39 != 5);
    lVar7 = lVar7 + 1;
    pvVar57 = (vrna_param_t *)(pvVar57->stack + 3);
    paaiVar18 = (int (*) [5] [5])((long)paaiVar18 + 100);
    paaiVar34 = (int (*) [5] [5])((long)paaiVar34 + 100);
    paaiVar24 = (int (*) [5] [5])((long)paaiVar24 + 100);
    paaiVar36 = (int (*) [5] [5])((long)paaiVar36 + 100);
    paaiVar40 = (int (*) [5] [5])((long)paaiVar40 + 100);
    paaiVar42 = (int (*) [5] [5])((long)paaiVar42 + 100);
    paaiVar10 = (int (*) [5] [5])((long)paaiVar10 + 100);
    paaiVar48 = (int (*) [5] [5])((long)paaiVar48 + 100);
    paaiVar51 = (int (*) [5] [5])((long)paaiVar51 + 100);
    paaiVar63 = (int (*) [5] [5])((long)paaiVar63 + 100);
    paaiVar54 = (int (*) [5] [5])((long)paaiVar54 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
  } while (lVar7 != 8);
  paiVar12 = pvVar5->dangle5;
  paiVar19 = dangle5_dH;
  paiVar25 = dangle5_37;
  paiVar37 = dangle3_dH;
  paiVar41 = dangle3_37;
  lVar7 = 0;
  do {
    lVar39 = 0;
    do {
      iVar3 = *(int *)((long)*paiVar19 + lVar39);
      uVar33 = (uint)((double)iVar3 - (double)(iVar3 - *(int *)((long)*paiVar25 + lVar39)) * dVar66)
      ;
      *(uint *)((long)*paiVar12 + lVar39) = (int)uVar33 >> 0x1f & uVar33;
      iVar3 = *(int *)((long)*paiVar37 + lVar39);
      uVar33 = (uint)((double)iVar3 - (double)(iVar3 - *(int *)((long)*paiVar41 + lVar39)) * dVar66)
      ;
      *(uint *)((long)paiVar12[8] + lVar39) = (int)uVar33 >> 0x1f & uVar33;
      lVar39 = lVar39 + 4;
    } while (lVar39 != 0x14);
    lVar7 = lVar7 + 1;
    paiVar19 = paiVar19 + 1;
    paiVar25 = paiVar25 + 1;
    paiVar12 = paiVar12 + 1;
    paiVar37 = paiVar37 + 1;
    paiVar41 = paiVar41 + 1;
  } while (lVar7 != 8);
  paaaiVar13 = pvVar5->int11;
  paaaiVar20 = int11_dH;
  paaaiVar26 = int11_37;
  lVar7 = 0;
  do {
    lVar39 = 0;
    paaaiVar44 = paaaiVar13;
    paiVar12 = (int (*) [5])paaaiVar26;
    paiVar19 = (int (*) [5])paaaiVar20;
    do {
      lVar11 = 0;
      paaaiVar32 = paaaiVar44;
      paiVar37 = paiVar12;
      paiVar25 = paiVar19;
      do {
        lVar58 = 0;
        do {
          iVar3 = (*(int (*) [5] [5])*paiVar25)[0][lVar58];
          (*paaaiVar32)[0][0][lVar58] =
               (int)((double)iVar3 -
                    (double)(iVar3 - (*(int (*) [5] [5])*paiVar37)[0][lVar58]) * dVar66);
          lVar58 = lVar58 + 1;
        } while (lVar58 != 5);
        lVar11 = lVar11 + 1;
        paiVar25 = paiVar25 + 1;
        paiVar37 = paiVar37 + 1;
        paaaiVar32 = (int (*) [8] [5] [5])((*paaaiVar32)[0] + 1);
      } while (lVar11 != 5);
      lVar39 = lVar39 + 1;
      paiVar19 = paiVar19 + 5;
      paiVar12 = paiVar12 + 5;
      paaaiVar44 = (int (*) [8] [5] [5])(*paaaiVar44 + 1);
    } while (lVar39 != 8);
    lVar7 = lVar7 + 1;
    paaaiVar20 = (int (*) [8] [5] [5])((long)paaaiVar20 + 800);
    paaaiVar26 = (int (*) [8] [5] [5])((long)paaaiVar26 + 800);
    paaaiVar13 = paaaiVar13 + 1;
  } while (lVar7 != 8);
  paaaaiVar46 = pvVar5->int21;
  paaaaiVar21 = int21_dH;
  paaaaiVar27 = int21_37;
  lVar7 = 0;
  do {
    lVar39 = 0;
    paiVar12 = (int (*) [5])paaaaiVar21;
    paiVar19 = (int (*) [5])paaaaiVar27;
    paaaaiVar47 = paaaaiVar46;
    do {
      lVar11 = 0;
      paiVar25 = paiVar19;
      paiVar37 = paiVar12;
      paaaaiVar61 = paaaaiVar47;
      do {
        lVar58 = 0;
        paaaaiVar35 = paaaaiVar61;
        paiVar41 = paiVar37;
        paiVar43 = paiVar25;
        do {
          lVar38 = 0;
          do {
            iVar3 = (*(int (*) [5] [5] [5])*paiVar41)[0][0][lVar38];
            (*paaaaiVar35)[0][0][0][lVar38] =
                 (int)((double)iVar3 -
                      (double)(iVar3 - (*(int (*) [5] [5] [5])*paiVar43)[0][0][lVar38]) * dVar66);
            lVar38 = lVar38 + 1;
          } while (lVar38 != 5);
          lVar58 = lVar58 + 1;
          paiVar41 = paiVar41 + 1;
          paiVar43 = paiVar43 + 1;
          paaaaiVar35 = (int (*) [8] [5] [5] [5])((*paaaaiVar35)[0][0] + 1);
        } while (lVar58 != 5);
        lVar11 = lVar11 + 1;
        paiVar37 = (int (*) [5])(*paiVar37 + 0x19);
        paiVar25 = (int (*) [5])(*paiVar25 + 0x19);
        paaaaiVar61 = (int (*) [8] [5] [5] [5])((*paaaaiVar61)[0] + 1);
      } while (lVar11 != 5);
      lVar39 = lVar39 + 1;
      paiVar12 = paiVar12 + 0x19;
      paiVar19 = paiVar19 + 0x19;
      paaaaiVar47 = (int (*) [8] [5] [5] [5])(*paaaaiVar47 + 1);
    } while (lVar39 != 8);
    lVar7 = lVar7 + 1;
    paaaaiVar21 = (int (*) [8] [5] [5] [5])((long)paaaaiVar21 + 4000);
    paaaaiVar27 = (int (*) [8] [5] [5] [5])((long)paaaaiVar27 + 4000);
    paaaaiVar46 = paaaaiVar46 + 1;
  } while (lVar7 != 8);
  paaaaaiVar14 = pvVar5->int22;
  paaaaaiVar22 = int22_dH;
  paaaaaiVar28 = int22_37;
  lVar7 = 0;
  do {
    lVar39 = 0;
    paaaaaiVar15 = paaaaaiVar14;
    paiVar12 = (int (*) [5])paaaaaiVar28;
    paiVar19 = (int (*) [5])paaaaaiVar22;
    do {
      lVar11 = 0;
      paaaaaiVar16 = paaaaaiVar15;
      paiVar25 = paiVar19;
      paiVar37 = paiVar12;
      do {
        lVar58 = 0;
        paiVar41 = paiVar25;
        paaaaaiVar50 = paaaaaiVar16;
        paiVar43 = paiVar37;
        do {
          lVar38 = 0;
          paaaaiVar56 = (int (*) [5] [5] [5] [5])paiVar43;
          paaaaiVar59 = (int (*) [5] [5] [5] [5])paiVar41;
          paaaaaiVar65 = paaaaaiVar50;
          do {
            lVar62 = 0;
            do {
              iVar3 = (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar59)[0][0][0][lVar62];
              (*paaaaaiVar65)[0][0][0][0][lVar62] =
                   (int)((double)iVar3 -
                        (double)(iVar3 - (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar56)[0][0]
                                         [0][lVar62]) * dVar66);
              lVar62 = lVar62 + 1;
            } while (lVar62 != 5);
            lVar38 = lVar38 + 1;
            paaaaiVar59 = (int (*) [5] [5] [5] [5])((long)paaaaiVar59 + 0x14);
            paaaaiVar56 = (int (*) [5] [5] [5] [5])((long)paaaaiVar56 + 0x14);
            paaaaaiVar65 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar65)[0][0][0] + 1);
          } while (lVar38 != 5);
          lVar58 = lVar58 + 1;
          paiVar41 = (int (*) [5])(*paiVar41 + 0x19);
          paiVar43 = (int (*) [5])(*paiVar43 + 0x19);
          paaaaaiVar50 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar50)[0][0] + 1);
        } while (lVar58 != 5);
        lVar11 = lVar11 + 1;
        paiVar25 = paiVar25 + 0x19;
        paiVar37 = paiVar37 + 0x19;
        paaaaaiVar16 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar16)[0] + 1);
      } while (lVar11 != 5);
      lVar39 = lVar39 + 1;
      paiVar19 = paiVar19 + 0x7d;
      paiVar12 = paiVar12 + 0x7d;
      paaaaaiVar15 = (int (*) [8] [5] [5] [5] [5])(*paaaaaiVar15 + 1);
    } while (lVar39 != 8);
    lVar7 = lVar7 + 1;
    paaaaaiVar22 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar22 + 20000);
    paaaaaiVar28 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar28 + 20000);
    paaaaaiVar14 = paaaaaiVar14 + 1;
  } while (lVar7 != 8);
  strncpy(pvVar5->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar5->Triloops,Triloops,0xf1);
  strncpy(pvVar5->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar5->id = id;
  return pvVar5;
}

Assistant:

PRIVATE vrna_param_t *
get_scaled_params(vrna_md_t *md)
{
  unsigned int  i, j, k, l;
  double        tempf;
  vrna_param_t  *params;

  params = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));

  memset(params->param_file, '\0', 256);
  if (last_parameter_file() != NULL)
    strncpy(params->param_file, last_parameter_file(), 255);

  params->model_details = *md;  /* copy over the model details */
  params->temperature   = md->temperature;
  tempf                 = ((params->temperature + K0) / Tmeasure);

  params->ninio[2]              = RESCALE_dG(ninio37, niniodH, tempf);
  params->lxc                   = lxc37 * tempf;
  params->TripleC               = RESCALE_dG(TripleC37, TripleCdH, tempf);
  params->MultipleCA            = RESCALE_dG(MultipleCA37, MultipleCAdH, tempf);
  params->MultipleCB            = RESCALE_dG(MultipleCB37, MultipleCBdH, tempf);
  params->TerminalAU            = RESCALE_dG(TerminalAU37, TerminalAUdH, tempf);
  params->DuplexInit            = RESCALE_dG(DuplexInit37, DuplexInitdH, tempf);
  params->MLbase                = RESCALE_dG(ML_BASE37, ML_BASEdH, tempf);
  // Pseudoknot -- added by Mateo 2/14/23
  params->PS_penalty            = -138;
  params->PSM_penalty           = 1007; 
  params->PSP_penalty           = 1500; 
  params->PB_penalty            = 246; 
  params->PUP_penalty           = 6; 
  params->PPS_penalty           = 96; 
  params->e_stP_penalty         = .89; 
  params->e_intP_penalty        = .74;
  params->ap_penalty            = 341;
  params->bp_penalty            = 56;
  params->cp_penalty            = 12;
  params->a_penalty            = 339; // Fix later
  params->b_penalty            = 3;
  params->c_penalty            = 2;
  //
  params->MLclosing             = RESCALE_dG(ML_closing37, ML_closingdH, tempf);
  params->gquadLayerMismatch    = RESCALE_dG(GQuadLayerMismatch37, GQuadLayerMismatchH, tempf);
  params->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, tempf);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, tempf);
      params->gquad[i][j] = (int)GQuadAlpha_T * (i - 1) + (int)(((double)GQuadBeta_T) * log(j - 2));
    }

  for (i = 0; i < 31; i++)
    params->hairpin[i] = RESCALE_dG(hairpin37[i], hairpindH[i], tempf);

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    params->bulge[i]          = RESCALE_dG(bulge37[i], bulgedH[i], tempf);
    params->internal_loop[i]  = RESCALE_dG(internal_loop37[i], internal_loopdH[i], tempf);
  }

  for (; i <= MAXLOOP; i++) {
    params->bulge[i] = params->bulge[30] +
                       (int)(params->lxc * log((double)(i) / 30.));
    params->internal_loop[i] = params->internal_loop[30] +
                               (int)(params->lxc * log((double)(i) / 30.));
  }

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    params->Tetraloop_E[i] = RESCALE_dG(Tetraloop37[i], TetraloopdH[i], tempf);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    params->Triloop_E[i] = RESCALE_dG(Triloop37[i], TriloopdH[i], tempf);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    params->Hexaloop_E[i] = RESCALE_dG(Hexaloop37[i], HexaloopdH[i], tempf);

  for (i = 0; i <= NBPAIRS; i++)
    params->MLintern[i] = RESCALE_dG(ML_intern37, ML_interndH, tempf);

  /* stacks    G(T) = H - [H - G(T0)]*T/T0 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      params->stack[i][j] = RESCALE_dG(stack37[i][j],
                                       stackdH[i][j],
                                       tempf);

  /* mismatches */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        int mm;
        params->mismatchI[i][j][k] = RESCALE_dG(mismatchI37[i][j][k],
                                                mismatchIdH[i][j][k],
                                                tempf);
        params->mismatchH[i][j][k] = RESCALE_dG(mismatchH37[i][j][k],
                                                mismatchHdH[i][j][k],
                                                tempf);
        params->mismatch1nI[i][j][k] = RESCALE_dG(mismatch1nI37[i][j][k],
                                                  mismatch1nIdH[i][j][k],
                                                  tempf);
        params->mismatch23I[i][j][k] = RESCALE_dG(mismatch23I37[i][j][k],
                                                  mismatch23IdH[i][j][k],
                                                  tempf);
        if (md->dangles) {
          mm = RESCALE_dG(mismatchM37[i][j][k],
                          mismatchMdH[i][j][k],
                          tempf);
          params->mismatchM[i][j][k]  = (mm > 0) ? 0 : mm;
          mm                          = RESCALE_dG(mismatchExt37[i][j][k],
                                                   mismatchExtdH[i][j][k],
                                                   tempf);
          params->mismatchExt[i][j][k] = (mm > 0) ? 0 : mm;
        } else {
          params->mismatchM[i][j][k] = params->mismatchExt[i][j][k] = 0;
        }
      }

  /* dangles */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++) {
      int dd;
      dd = RESCALE_dG(dangle5_37[i][j],
                      dangle5_dH[i][j],
                      tempf);
      params->dangle5[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
      dd                    = RESCALE_dG(dangle3_37[i][j],
                                         dangle3_dH[i][j],
                                         tempf);
      params->dangle3[i][j] = (dd > 0) ? 0 : dd;  /* must be <= 0 */
    }

  /* interior 1x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++)
          params->int11[i][j][k][l] = RESCALE_dG(int11_37[i][j][k][l],
                                                 int11_dH[i][j][k][l],
                                                 tempf);

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++)
            params->int21[i][j][k][l][m] = RESCALE_dG(int21_37[i][j][k][l][m],
                                                      int21_dH[i][j][k][l][m],
                                                      tempf);
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++)
              params->int22[i][j][k][l][m][n] = RESCALE_dG(int22_37[i][j][k][l][m][n],
                                                           int22_dH[i][j][k][l][m][n],
                                                           tempf);
        }

  strncpy(params->Tetraloops, Tetraloops, 281);
  strncpy(params->Triloops, Triloops, 241);
  strncpy(params->Hexaloops, Hexaloops, 361);

  params->id = ++id;
  return params;
}